

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_htmlDocContentDumpFormatOutput(void)

{
  int iVar1;
  int iVar2;
  xmlOutputBufferPtr val;
  xmlDocPtr val_00;
  char *val_01;
  int local_44;
  int n_format;
  int format;
  int n_encoding;
  char *encoding;
  int n_cur;
  xmlDocPtr cur;
  int n_buf;
  xmlOutputBufferPtr buf;
  int mem_base;
  int test_ret;
  
  buf._4_4_ = 0;
  for (cur._4_4_ = 0; (int)cur._4_4_ < 2; cur._4_4_ = cur._4_4_ + 1) {
    for (encoding._4_4_ = 0; (int)encoding._4_4_ < 4; encoding._4_4_ = encoding._4_4_ + 1) {
      for (n_format = 0; n_format < 4; n_format = n_format + 1) {
        for (local_44 = 0; local_44 < 4; local_44 = local_44 + 1) {
          iVar1 = xmlMemBlocks();
          val = gen_xmlOutputBufferPtr(cur._4_4_,0);
          val_00 = gen_xmlDocPtr(encoding._4_4_,1);
          val_01 = gen_const_char_ptr(n_format,2);
          iVar2 = gen_int(local_44,3);
          htmlDocContentDumpFormatOutput(val,val_00,val_01,iVar2);
          call_tests = call_tests + 1;
          des_xmlOutputBufferPtr(cur._4_4_,val,0);
          des_xmlDocPtr(encoding._4_4_,val_00,1);
          des_const_char_ptr(n_format,val_01,2);
          des_int(local_44,iVar2,3);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in htmlDocContentDumpFormatOutput",
                   (ulong)(uint)(iVar2 - iVar1));
            buf._4_4_ = buf._4_4_ + 1;
            printf(" %d",(ulong)cur._4_4_);
            printf(" %d",(ulong)encoding._4_4_);
            printf(" %d",(ulong)(uint)n_format);
            printf(" %d");
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return buf._4_4_;
}

Assistant:

static int
test_htmlDocContentDumpFormatOutput(void) {
    int test_ret = 0;

#if defined(LIBXML_HTML_ENABLED) && defined(LIBXML_OUTPUT_ENABLED)
    int mem_base;
    xmlOutputBufferPtr buf; /* the HTML buffer output */
    int n_buf;
    xmlDocPtr cur; /* the document */
    int n_cur;
    const char * encoding; /* the encoding string (unused) */
    int n_encoding;
    int format; /* should formatting spaces been added */
    int n_format;

    for (n_buf = 0;n_buf < gen_nb_xmlOutputBufferPtr;n_buf++) {
    for (n_cur = 0;n_cur < gen_nb_xmlDocPtr;n_cur++) {
    for (n_encoding = 0;n_encoding < gen_nb_const_char_ptr;n_encoding++) {
    for (n_format = 0;n_format < gen_nb_int;n_format++) {
        mem_base = xmlMemBlocks();
        buf = gen_xmlOutputBufferPtr(n_buf, 0);
        cur = gen_xmlDocPtr(n_cur, 1);
        encoding = gen_const_char_ptr(n_encoding, 2);
        format = gen_int(n_format, 3);

        htmlDocContentDumpFormatOutput(buf, cur, encoding, format);
        call_tests++;
        des_xmlOutputBufferPtr(n_buf, buf, 0);
        des_xmlDocPtr(n_cur, cur, 1);
        des_const_char_ptr(n_encoding, encoding, 2);
        des_int(n_format, format, 3);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in htmlDocContentDumpFormatOutput",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_buf);
            printf(" %d", n_cur);
            printf(" %d", n_encoding);
            printf(" %d", n_format);
            printf("\n");
        }
    }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}